

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

string * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>
::getStorageFilePath_abi_cxx11_
          (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
           *this)

{
  element_type *this_00;
  string *psVar1;
  string *in_RDI;
  
  this_00 = std::
            __shared_ptr_access<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x25c559);
  psVar1 = io::TemporaryFile::getPath_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  return in_RDI;
}

Assistant:

[[nodiscard]] std::string getStorageFilePath() const noexcept {
        return storageFile_->getPath();
    }